

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O1

void __thiscall AVO::Simulator::doStep(Simulator *this)

{
  pointer ppAVar1;
  long lVar2;
  
  KdTree::buildAgentTree(this->kdTree_);
  ppAVar1 = (this->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->agents_).
                              super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1) >> 3)) {
    lVar2 = 0;
    do {
      Agent::computeNeighbors(ppAVar1[lVar2],this->kdTree_);
      Agent::computeNewVelocity
                ((this->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar2],this->timeStep_);
      lVar2 = lVar2 + 1;
      ppAVar1 = (this->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar2 < (int)((ulong)((long)(this->agents_).
                                         super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1)
                          >> 3));
  }
  ppAVar1 = (this->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->agents_).
                              super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1) >> 3)) {
    lVar2 = 0;
    do {
      Agent::update(ppAVar1[lVar2],this->timeStep_);
      lVar2 = lVar2 + 1;
      ppAVar1 = (this->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar2 < (int)((ulong)((long)(this->agents_).
                                         super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1)
                          >> 3));
  }
  this->globalTime_ = this->timeStep_ + this->globalTime_;
  return;
}

Assistant:

void Simulator::doStep() {
  kdTree_->buildAgentTree();

#ifdef _OPENMP
#pragma omp parallel for
#endif  // _OPENMP
  for (int agentNo = 0; agentNo < static_cast<int>(agents_.size()); ++agentNo) {
    agents_[agentNo]->computeNeighbors(kdTree_);
    agents_[agentNo]->computeNewVelocity(timeStep_);
  }

#ifdef _OPENMP
#pragma omp parallel for
#endif  // _OPENMP
  for (int agentNo = 0; agentNo < static_cast<int>(agents_.size()); ++agentNo) {
    agents_[agentNo]->update(timeStep_);
  }

  globalTime_ += timeStep_;
}